

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llil.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  llil_t<32UL> llil;
  
  if (1 < argc) {
    llil_t<32UL>::llil_t(&llil);
    lVar1 = std::chrono::_V2::system_clock::now();
    llil_t<32ul>::get_properties<6ul>((llil_t<32ul> *)&llil,argv + 1,argc + -1);
    lVar2 = std::chrono::_V2::system_clock::now();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,"get properties      ",0x14);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 8;
    poVar3 = std::ostream::_M_insert<double>((double)((lVar2 - lVar1) / 1000000) / 1000.0);
    std::operator<<(poVar3," secs\n");
    llil_t<32UL>::~llil_t(&llil);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"usage: llil4map file1 file2 ... >out.txt\n");
  }
  return (uint)(1 >= argc);
}

Assistant:

int main(int argc, char* argv[])
{
   if (argc < 2) { std::cerr << "usage: llil4map file1 file2 ... >out.txt\n";  return 1; }

   llil_t<32> llil;

   show_time("get properties      ", [&]() { llil.get_properties<6>(&argv[1], argc - 1); });

   return 0;
}